

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mapchan.h
# Opt level: O0

ON_MappingRef * __thiscall ON_MappingRef::operator=(ON_MappingRef *this,ON_MappingRef *param_1)

{
  unsigned_short uVar1;
  unsigned_short uVar2;
  ON_MappingRef *param_1_local;
  ON_MappingRef *this_local;
  
  uVar1 = (param_1->m_plugin_id).Data2;
  uVar2 = (param_1->m_plugin_id).Data3;
  (this->m_plugin_id).Data1 = (param_1->m_plugin_id).Data1;
  (this->m_plugin_id).Data2 = uVar1;
  (this->m_plugin_id).Data3 = uVar2;
  *(undefined8 *)(this->m_plugin_id).Data4 = *(undefined8 *)(param_1->m_plugin_id).Data4;
  ON_SimpleArray<ON_MappingChannel>::operator=
            (&this->m_mapping_channels,&param_1->m_mapping_channels);
  return this;
}

Assistant:

class ON_CLASS ON_MappingRef
{
public:
  ON_MappingRef();
  void Default();
  int Compare( const ON_MappingRef& other ) const;
  bool Write( ON_BinaryArchive& archive ) const;
  bool Read( ON_BinaryArchive& archive );

  bool IsValid( ON_TextLog* text_log ) const;


  bool Transform( const ON_Xform& xform );

  ON_UUID m_plugin_id;   // Identifies a rendering plugin

  /*
  Parameters:
    mapping_channel_id - [in]
    mapping_id - [in]
      ON_TextureMapping id
  Returns:
    A pointer to the plug-in's mapping channel, if there
    is one. Otherwise nullptr is returned.
  */
  const ON_MappingChannel* MappingChannel( 
    int mapping_channel_id
    ) const;

  const ON_MappingChannel* MappingChannel( 
    const ON_UUID& mapping_id
    ) const;


  /*
  Parameters:
    mapping_channel_id - [in]
    mapping_id - [in]
      ON_TextureMapping id
  Returns:
    True if the mapping channel was added or a perfect
    match already existed.  False if a mapping channel 
    with a different mapping_id already exists for this
    plug-in and channel.
  */
  bool AddMappingChannel(
    int mapping_channel_id,
    const ON_UUID& mapping_id
    );

  /*
  Parameters:
    mapping_channel_id - [in]
    mapping_id - [in]
      ON_TextureMapping id
  Returns:
    True if a matching mapping channel was deleted.
  */
  bool DeleteMappingChannel(
    int mapping_channel_id
    );

  bool DeleteMappingChannel(
    const ON_UUID& mapping_id
    );

  /*
  Parameters:
    old_mapping_channel_id - [in]
    new_mapping_channel_id - [in]
  Returns:
    True if a matching mapping channel was found and changed.
  */
  bool ChangeMappingChannel(
    int old_mapping_channel_id,
    int new_mapping_channel_id
    );

  // Use AddMappingChannel() if you  want to add an 
  // element to this array.
  //
  // Every mapping channel in this array must have
  // a distinct value of ON_MappingChannel.m_mapping_channel_id
  ON_SimpleArray<ON_MappingChannel> m_mapping_channels;
}